

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

void featurePad(pBox *pbox,pBox *outpBox,int pad,int padw,int padh)

{
  int iVar1;
  int row;
  int iVar2;
  mydataFmt *pmVar3;
  mydataFmt *__src;
  int row_1;
  
  pmVar3 = outpBox->pdata;
  __src = pbox->pdata;
  if (pad == -1) {
    for (iVar2 = 0; iVar1 = outpBox->height, iVar2 < outpBox->channel * iVar1; iVar2 = iVar2 + 1) {
      if ((iVar2 % iVar1 < padh) || (iVar1 + ~padh < iVar2 % iVar1)) {
        pmVar3 = pmVar3 + outpBox->width;
      }
      else {
        memcpy(pmVar3 + padw,__src,(long)pbox->width << 2);
        pmVar3 = pmVar3 + padw + (long)pbox->width + (long)padw;
        __src = __src + pbox->width;
      }
    }
  }
  else {
    for (iVar2 = 0; iVar1 = outpBox->height, iVar2 < outpBox->channel * iVar1; iVar2 = iVar2 + 1) {
      if ((iVar2 % iVar1 < pad) || (iVar1 + ~pad < iVar2 % iVar1)) {
        pmVar3 = pmVar3 + outpBox->width;
      }
      else {
        memcpy(pmVar3 + pad,__src,(long)pbox->width << 2);
        pmVar3 = pmVar3 + pad + (long)pbox->width + (long)pad;
        __src = __src + pbox->width;
      }
    }
  }
  return;
}

Assistant:

void featurePad(const pBox *pbox, pBox *outpBox, const int pad, const int padw, const int padh) {
    mydataFmt *p = outpBox->pdata;
    mydataFmt *pIn = pbox->pdata;
    if (pad == -1) {
        for (int row = 0; row < outpBox->channel * outpBox->height; row++) {
            if ((row % outpBox->height) < padh || (row % outpBox->height > (outpBox->height - padh - 1))) {
                p += outpBox->width;
                continue;
            }
            p += padw;
            memcpy(p, pIn, pbox->width * sizeof(mydataFmt));
            p += pbox->width + padw;
            pIn += pbox->width;
        }
    } else {
        for (int row = 0; row < outpBox->channel * outpBox->height; row++) {
            if ((row % outpBox->height) < pad || (row % outpBox->height > (outpBox->height - pad - 1))) {
                p += outpBox->width;
                continue;
            }
            p += pad;
            memcpy(p, pIn, pbox->width * sizeof(mydataFmt));
            p += pbox->width + pad;
            pIn += pbox->width;
        }
    }
}